

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O3

void __thiscall
MacProj::mlmg_mac_solve
          (MacProj *this,Amr *a_parent,MultiFab *cphi,BCRec *a_phys_bc,BCRec *density_math_bc,
          int level,Real a_mac_tol,Real a_mac_abs_tol,Real rhs_scale,MultiFab *rho,MultiFab *Rhs,
          Array<MultiFab_*,_3> *u_mac,MultiFab *mac_phi,Array<MultiFab_*,_3> *fluxes)

{
  _Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> _Var1;
  long *plVar2;
  double numerator;
  MultiFab *crse;
  pointer this_00;
  int idim_1;
  undefined4 uVar3;
  _Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> this_01;
  LinOpBCType LVar4;
  LinOpBCType LVar5;
  int idim;
  long lVar6;
  initializer_list<amrex::BCRec> __l;
  initializer_list<std::array<amrex::MultiFab_*,_3UL>_> __l_00;
  initializer_list<std::array<const_amrex::MultiFab_*,_3UL>_> __l_01;
  initializer_list<amrex::Geometry> __l_02;
  initializer_list<const_amrex::MultiFab_*> __l_03;
  initializer_list<amrex::MultiFab_*> __l_04;
  initializer_list<std::array<amrex::MultiFab_*,_3UL>_> __l_05;
  initializer_list<amrex::MultiFab_*> __l_06;
  Periodicity PVar7;
  allocator_type local_3d0;
  allocator_type local_3cf;
  allocator_type local_3ce;
  allocator_type local_3cd;
  int max_coarsening_level;
  Array<std::unique_ptr<MultiFab>,_3> bcoefs;
  array<amrex::MultiFab_*,_3UL> local_398;
  array<amrex::MultiFab_*,_3UL> local_378;
  array<amrex::LinOpBCType,_3UL> mlmg_lobc;
  pointer local_350;
  LPInfo local_348;
  Vector<const_amrex::iMultiFab_*,_std::allocator<const_amrex::iMultiFab_*>_> local_328;
  Real local_310;
  Real local_308;
  BCRec *local_300;
  MultiFab *local_2f8;
  Real local_2f0;
  pointer local_2e8;
  BCRec *local_2e0;
  long local_2d8;
  vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> local_2d0;
  vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> local_2b8;
  Geometry local_2a0;
  array<amrex::LinOpBCType,_3UL> mlmg_hibc;
  MultiFab *local_1c0;
  MacProjector macproj;
  ParmParse pp;
  
  local_2d8 = (long)level;
  local_2e8 = (a_parent->super_AmrCore).super_AmrMesh.geom.
              super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
              super__Vector_impl_data._M_start + local_2d8;
  bcoefs._M_elems[0]._M_t.
  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true>)
       (__uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>)0x0;
  bcoefs._M_elems[1]._M_t.
  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true>)
       (__uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>)0x0;
  bcoefs._M_elems[2]._M_t.
  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true>)
       (__uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>)0x0;
  lVar6 = 0;
  local_310 = a_mac_tol;
  local_308 = a_mac_abs_tol;
  local_300 = a_phys_bc;
  local_2f8 = cphi;
  local_2f0 = rhs_scale;
  local_2e0 = density_math_bc;
  do {
    if ((int)lVar6 == 1) {
      uVar3 = 0;
      local_2a0.super_CoordSys.c_sys = cartesian;
      local_2a0.super_CoordSys._4_4_ = 1;
    }
    else if ((int)lVar6 == 0) {
      local_2a0.super_CoordSys.c_sys = RZ;
      local_2a0.super_CoordSys._4_4_ = 0;
      uVar3 = 0;
    }
    else {
      uVar3 = 1;
      local_2a0.super_CoordSys.c_sys = cartesian;
      local_2a0.super_CoordSys._4_4_ = 0;
    }
    local_2a0.super_CoordSys.offset[0] =
         (Real)CONCAT44(local_2a0.super_CoordSys.offset[0]._4_4_,uVar3);
    amrex::convert((BoxArray *)&macproj,
                   &(Rhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
                   (IntVect *)&local_2a0);
    this_01.super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (_Head_base<0UL,_amrex::MultiFab_*,_false>)operator_new(0x180);
    local_2a0.super_CoordSys._0_8_ = (void *)0x1;
    local_2a0.super_CoordSys.offset[2] = 0.0;
    local_2a0.super_CoordSys.dx[0] = 0.0;
    local_2a0.super_CoordSys.offset[0] = 0.0;
    local_2a0.super_CoordSys.offset[1] = 0.0;
    amrex::MultiFab::MultiFab
              ((MultiFab *)this_01.super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
               (BoxArray *)&macproj,
               &(Rhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,1,0,
               (MFInfo *)&local_2a0,
               *(FabFactory<amrex::FArrayBox> **)
                ((long)(a_parent->amr_level).
                       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_2d8]._M_t.
                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                + 0x218));
    _Var1.super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         bcoefs._M_elems[lVar6]._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
         super__Head_base<0UL,_amrex::MultiFab_*,_false>;
    bcoefs._M_elems[lVar6]._M_t.
    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false> =
         this_01.super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
    if (_Var1.super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl != (MultiFab *)0x0) {
      (**(code **)(*(long *)_Var1.super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 8))
                ();
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2a0.super_CoordSys.offset + 1));
    amrex::BoxArray::~BoxArray((BoxArray *)&macproj);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  macproj.m_poisson._M_t.
  super___uniq_ptr_impl<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MLPoisson_*,_std::default_delete<amrex::MLPoisson>_>.
  super__Head_base<0UL,_amrex::MLPoisson_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>,_true,_true>)
       (__uniq_ptr_data<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>,_true,_true>)
       bcoefs._M_elems[0]._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
       super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  macproj.m_abeclap._M_t.
  super___uniq_ptr_impl<amrex::MLABecLaplacian,_std::default_delete<amrex::MLABecLaplacian>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MLABecLaplacian_*,_std::default_delete<amrex::MLABecLaplacian>_>.
  super__Head_base<0UL,_amrex::MLABecLaplacian_*,_false>._M_head_impl._0_4_ =
       (int)bcoefs._M_elems[1]._M_t.
            super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
            super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
            super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  macproj.m_abeclap._M_t.
  super___uniq_ptr_impl<amrex::MLABecLaplacian,_std::default_delete<amrex::MLABecLaplacian>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MLABecLaplacian_*,_std::default_delete<amrex::MLABecLaplacian>_>.
  super__Head_base<0UL,_amrex::MLABecLaplacian_*,_false>._M_head_impl._4_4_ =
       bcoefs._M_elems[1]._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
       super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl._4_4_;
  macproj.m_eb_abeclap._M_t.
  super___uniq_ptr_impl<amrex::MLEBABecLap,_std::default_delete<amrex::MLEBABecLap>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MLEBABecLap_*,_std::default_delete<amrex::MLEBABecLap>_>.
  super__Head_base<0UL,_amrex::MLEBABecLap_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::MLEBABecLap,_std::default_delete<amrex::MLEBABecLap>,_true,_true>)
       (__uniq_ptr_data<amrex::MLEBABecLap,_std::default_delete<amrex::MLEBABecLap>,_true,_true>)
       bcoefs._M_elems[2]._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
       super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  pp.m_pstack.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = *(_Elt_pointer *)(local_2e0->bc + 4);
  pp.m_pstack.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = *(_Map_pointer *)local_2e0->bc;
  pp.m_pstack.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = *(size_t *)(local_2e0->bc + 2);
  __l._M_len = 1;
  __l._M_array = (iterator)&pp;
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
            ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&local_2a0,__l,
             (allocator_type *)&local_348);
  this_00 = local_2e8;
  amrex::EB_interp_CellCentroid_to_FaceCentroid
            (rho,(Array<MultiFab_*,_3> *)&macproj,0,0,1,local_2e8,
             (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&local_2a0);
  if ((void *)local_2a0.super_CoordSys._0_8_ != (void *)0x0) {
    operator_delete((void *)local_2a0.super_CoordSys._0_8_,
                    (long)local_2a0.super_CoordSys.offset[1] - local_2a0.super_CoordSys._0_8_);
  }
  numerator = 1.0 / local_2f0;
  lVar6 = 0;
  do {
    amrex::MultiFab::invert
              ((MultiFab *)
               bcoefs._M_elems[lVar6]._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>,numerator,0);
    _Var1.super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         bcoefs._M_elems[lVar6]._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
         super__Head_base<0UL,_amrex::MultiFab_*,_false>;
    PVar7 = amrex::Geometry::periodicity(this_00);
    macproj.m_poisson._M_t.
    super___uniq_ptr_impl<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MLPoisson_*,_std::default_delete<amrex::MLPoisson>_>.
    super__Head_base<0UL,_amrex::MLPoisson_*,_false>._M_head_impl = PVar7.period.vect._0_8_;
    macproj.m_abeclap._M_t.
    super___uniq_ptr_impl<amrex::MLABecLaplacian,_std::default_delete<amrex::MLABecLaplacian>_>._M_t
    .super__Tuple_impl<0UL,_amrex::MLABecLaplacian_*,_std::default_delete<amrex::MLABecLaplacian>_>.
    super__Head_base<0UL,_amrex::MLABecLaplacian_*,_false>._M_head_impl._0_4_ = PVar7.period.vect[2]
    ;
    amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
              ((FabArray<amrex::FArrayBox> *)
               _Var1.super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
               (Periodicity *)&macproj,false);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_348.do_agglomeration = true;
  local_348.do_consolidation = true;
  local_348.do_semicoarsening = false;
  local_348.agg_grid_size = -1;
  local_348.con_grid_size = -1;
  local_348.has_metric_term = true;
  local_348.max_coarsening_level = 0x1e;
  local_348.max_semicoarsening_level = 0;
  local_348.semicoarsening_direction = -1;
  local_348.hidden_direction = -1;
  max_coarsening_level = 100;
  macproj.m_poisson._M_t.
  super___uniq_ptr_impl<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MLPoisson_*,_std::default_delete<amrex::MLPoisson>_>.
  super__Head_base<0UL,_amrex::MLPoisson_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>,_true,_true>)
       (__uniq_ptr_data<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>,_true,_true>)
       &macproj.m_eb_abeclap;
  std::__cxx11::string::_M_construct<char_const*>((string *)&macproj,"mac_proj","");
  amrex::ParmParse::ParmParse(&pp,(string *)&macproj);
  if (macproj.m_poisson._M_t.
      super___uniq_ptr_impl<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MLPoisson_*,_std::default_delete<amrex::MLPoisson>_>.
      super__Head_base<0UL,_amrex::MLPoisson_*,_false>._M_head_impl !=
      (__uniq_ptr_data<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>,_true,_true>)
      &macproj.m_eb_abeclap) {
    operator_delete((void *)macproj.m_poisson._M_t.
                            super___uniq_ptr_impl<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::MLPoisson_*,_std::default_delete<amrex::MLPoisson>_>
                            .super__Head_base<0UL,_amrex::MLPoisson_*,_false>._M_head_impl,
                    (long)macproj.m_eb_abeclap._M_t.
                          super___uniq_ptr_impl<amrex::MLEBABecLap,_std::default_delete<amrex::MLEBABecLap>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::MLEBABecLap_*,_std::default_delete<amrex::MLEBABecLap>_>
                          .super__Head_base<0UL,_amrex::MLEBABecLap_*,_false>._M_head_impl + 1);
  }
  amrex::ParmParse::query(&pp,"mg_max_coarsening_level",&max_coarsening_level,0);
  local_348.max_coarsening_level = max_coarsening_level;
  local_348.do_consolidation = consolidation != 0;
  local_348.do_agglomeration = agglomeration != 0;
  local_398._M_elems[2] = u_mac->_M_elems[2];
  local_398._M_elems[0] = u_mac->_M_elems[0];
  local_398._M_elems[1] = u_mac->_M_elems[1];
  __l_00._M_len = 1;
  __l_00._M_array = &local_398;
  std::
  vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>::
  vector((vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
          *)&local_378,__l_00,&local_3cd);
  mlmg_hibc._M_elems._0_8_ =
       bcoefs._M_elems[0]._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
       super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  stack0xfffffffffffffe30 =
       (MultiFab *)
       bcoefs._M_elems[1]._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
       super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&mlmg_hibc;
  std::
  vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
  ::vector((vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
            *)&mlmg_lobc,__l_01,&local_3ce);
  memcpy(&local_2a0,this_00,200);
  __l_02._M_len = 1;
  __l_02._M_array = &local_2a0;
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
            (&local_2b8,__l_02,&local_3cf);
  local_1c0 = Rhs;
  __l_03._M_len = 1;
  __l_03._M_array = &local_1c0;
  std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
            (&local_2d0,__l_03,&local_3d0);
  local_328.super_vector<const_amrex::iMultiFab_*,_std::allocator<const_amrex::iMultiFab_*>_>.
  super__Vector_base<const_amrex::iMultiFab_*,_std::allocator<const_amrex::iMultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.super_vector<const_amrex::iMultiFab_*,_std::allocator<const_amrex::iMultiFab_*>_>.
  super__Vector_base<const_amrex::iMultiFab_*,_std::allocator<const_amrex::iMultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.super_vector<const_amrex::iMultiFab_*,_std::allocator<const_amrex::iMultiFab_*>_>.
  super__Vector_base<const_amrex::iMultiFab_*,_std::allocator<const_amrex::iMultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Hydro::MacProjector::MacProjector
            (&macproj,(Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                       *)&local_378,FaceCentroid,
             (Vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
              *)&mlmg_lobc,FaceCentroid,CellCenter,
             (Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)&local_2b8,&local_348,
             (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)&local_2d0
             ,CellCentroid,&local_328);
  crse = local_2f8;
  if (local_328.super_vector<const_amrex::iMultiFab_*,_std::allocator<const_amrex::iMultiFab_*>_>.
      super__Vector_base<const_amrex::iMultiFab_*,_std::allocator<const_amrex::iMultiFab_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_328.
                    super_vector<const_amrex::iMultiFab_*,_std::allocator<const_amrex::iMultiFab_*>_>
                    .
                    super__Vector_base<const_amrex::iMultiFab_*,_std::allocator<const_amrex::iMultiFab_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_328.
                          super_vector<const_amrex::iMultiFab_*,_std::allocator<const_amrex::iMultiFab_*>_>
                          .
                          super__Vector_base<const_amrex::iMultiFab_*,_std::allocator<const_amrex::iMultiFab_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.
                          super_vector<const_amrex::iMultiFab_*,_std::allocator<const_amrex::iMultiFab_*>_>
                          .
                          super__Vector_base<const_amrex::iMultiFab_*,_std::allocator<const_amrex::iMultiFab_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2d0.
      super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d0.
                    super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2d0.
                          super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d0.
                          super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2b8.super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b8.
                          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.
                          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (mlmg_lobc._M_elems._0_8_ != 0) {
    operator_delete((void *)mlmg_lobc._M_elems._0_8_,(long)local_350 - mlmg_lobc._M_elems._0_8_);
  }
  if (local_378._M_elems[0] != (MultiFab *)0x0) {
    operator_delete(local_378._M_elems[0],(long)local_378._M_elems[2] - (long)local_378._M_elems[0])
    ;
  }
  lVar6 = 0;
  do {
    LVar4 = Periodic;
    LVar5 = Periodic;
    if (*(char *)((long)(this_00->super_CoordSys).inv_dx + lVar6 + 0x19) == '\0') {
      LVar4 = (local_300->bc[lVar6] != 2) + Dirichlet;
      LVar5 = (local_300->bc[lVar6 + 3] != 2) + Dirichlet;
    }
    mlmg_lobc._M_elems[lVar6] = LVar4;
    mlmg_hibc._M_elems[lVar6] = LVar5;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  Hydro::MacProjector::setDomainBC(&macproj,&mlmg_lobc,&mlmg_hibc);
  if (crse != (MultiFab *)0x0 && 0 < level) {
    amrex::MLLinOp::setCoarseFineBC
              (macproj.m_linop,crse,
               (a_parent->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
               super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
               super__Vector_impl_data._M_start[(ulong)(uint)level - 1].vect[0]);
  }
  Hydro::MacProjector::setLevelBC(&macproj,0,mac_phi);
  (macproj.m_linop)->maxorder = max_order;
  if (-1 < max_fmg_iter) {
    *(int *)((long)macproj.m_mlmg._M_t.
                   super___uniq_ptr_impl<amrex::MLMG,_std::default_delete<amrex::MLMG>_>._M_t.
                   super__Tuple_impl<0UL,_amrex::MLMG_*,_std::default_delete<amrex::MLMG>_>.
                   super__Head_base<0UL,_amrex::MLMG_*,_false>._M_head_impl + 0x1c) = max_fmg_iter;
  }
  local_378._M_elems[0] = mac_phi;
  __l_04._M_len = 1;
  __l_04._M_array = local_378._M_elems;
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_2a0,__l_04,
             (allocator_type *)&local_398);
  Hydro::MacProjector::project
            (&macproj,(Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_2a0,
             local_310,local_308);
  if ((void *)local_2a0.super_CoordSys._0_8_ != (void *)0x0) {
    operator_delete((void *)local_2a0.super_CoordSys._0_8_,
                    (long)local_2a0.super_CoordSys.offset[1] - local_2a0.super_CoordSys._0_8_);
  }
  if (fluxes->_M_elems[0] != (MultiFab *)0x0) {
    local_378._M_elems[2] = fluxes->_M_elems[2];
    local_378._M_elems[0] = fluxes->_M_elems[0];
    local_378._M_elems[1] = fluxes->_M_elems[1];
    __l_05._M_len = 1;
    __l_05._M_array = &local_378;
    std::
    vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
    ::vector((vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
              *)&local_2a0,__l_05,(allocator_type *)&local_2d0);
    local_2b8.super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)mac_phi;
    __l_06._M_len = 1;
    __l_06._M_array = (iterator)&local_2b8;
    std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_398,__l_06,
               (allocator_type *)&local_328);
    Hydro::MacProjector::getFluxes
              (&macproj,(Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                         *)&local_2a0,
               (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_398,
               FaceCentroid);
    if (local_398._M_elems[0] != (MultiFab *)0x0) {
      operator_delete(local_398._M_elems[0],
                      (long)local_398._M_elems[2] - (long)local_398._M_elems[0]);
    }
    if ((void *)local_2a0.super_CoordSys._0_8_ != (void *)0x0) {
      operator_delete((void *)local_2a0.super_CoordSys._0_8_,
                      (long)local_2a0.super_CoordSys.offset[1] - local_2a0.super_CoordSys._0_8_);
    }
  }
  Hydro::MacProjector::~MacProjector(&macproj);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&pp);
  lVar6 = 0x10;
  do {
    plVar2 = *(long **)((long)&bcoefs._M_elems[0]._M_t.
                               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                               .super__Head_base<0UL,_amrex::MultiFab_*,_false> + lVar6);
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
    *(undefined8 *)
     ((long)&bcoefs._M_elems[0]._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false> + lVar6) = 0;
    lVar6 = lVar6 + -8;
  } while (lVar6 != -8);
  return;
}

Assistant:

void
MacProj::mlmg_mac_solve (Amr* a_parent, const MultiFab* cphi, const BCRec& a_phys_bc,
			 const BCRec& density_math_bc,
			 int level, Real a_mac_tol, Real a_mac_abs_tol, Real rhs_scale,
			 const MultiFab &rho, const MultiFab &Rhs,
			 Array<MultiFab*,AMREX_SPACEDIM>& u_mac, MultiFab *mac_phi,
			 Array<MultiFab*,AMREX_SPACEDIM>& fluxes)
{
    const Geometry& geom = a_parent->Geom(level);
    const BoxArray& ba = Rhs.boxArray();
    const DistributionMapping& dm = Rhs.DistributionMap();

    //
    // Compute beta coefficients
    //
    Array<std::unique_ptr<MultiFab>,AMREX_SPACEDIM> bcoefs;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
        BoxArray nba = amrex::convert(ba,IntVect::TheDimensionVector(idim));
        bcoefs[idim].reset(new  MultiFab(nba, dm, 1, 0, MFInfo(),
					 (a_parent->getLevel(level)).Factory()));
    }

    //
    // Set bcoefs to the average of Density at the faces
    // In the EB case, they will be defined at the Face Centroid
    //
#ifdef AMREX_USE_EB
    EB_interp_CellCentroid_to_FaceCentroid( rho, GetArrOfPtrs(bcoefs), 0, 0, 1,
					    geom, {density_math_bc});
#else
    amrex::ignore_unused(density_math_bc);
    average_cellcenter_to_face(GetArrOfPtrs(bcoefs), rho, geom);
#endif

    //
    // Now invert the coefficients and apply scale factor
    //
    int ng_for_invert(0);
    Real scale_factor(1.0/rhs_scale);

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
        bcoefs[idim]->invert(scale_factor,ng_for_invert);
        bcoefs[idim]->FillBoundary( geom.periodicity() );
    }

    //
    // Create MacProjector Object
    //
    LPInfo info;
    int max_coarsening_level(100);
    ParmParse pp("mac_proj");
    pp.query("mg_max_coarsening_level", max_coarsening_level);

    info.setMaxCoarseningLevel(max_coarsening_level);
    info.setAgglomeration(agglomeration);
    info.setConsolidation(consolidation);

    //
    // To use phi on CellCentroids, must also call
    // macproj.get_linop().setEBDirichlet (int amrlev, const MultiFab& phi, const MultiFab& beta)
    // or
    // macproj.get_linop().setEBHomogDirichlet (int amrlev, const MultiFab& beta)
    //
    // Location information is not used for non-EB
    //
    Hydro::MacProjector macproj( {u_mac}, MLMG::Location::FaceCentroid, // Location of umac (face center vs centroid)
                                {GetArrOfConstPtrs(bcoefs)}, MLMG::Location::FaceCentroid,  // Location of beta (face center vs centroid)
                                MLMG::Location::CellCenter,           // Location of solution variable phi (cell center vs centroid)
                                {geom}, info,
                                {&Rhs}, MLMG::Location::CellCentroid);  // Location of RHS (cell center vs centroid)

    //
    // Set BCs
    //
    std::array<MLLinOp::BCType,AMREX_SPACEDIM> mlmg_lobc;
    std::array<MLLinOp::BCType,AMREX_SPACEDIM> mlmg_hibc;
    set_mac_solve_bc(mlmg_lobc, mlmg_hibc, a_phys_bc, geom);

    macproj.setDomainBC(mlmg_lobc, mlmg_hibc);
    if (level > 0 && cphi)
    {
        macproj.setCoarseFineBC(cphi, a_parent->refRatio(level-1)[0]);
    }
    macproj.setLevelBC(0, mac_phi);

    // MacProj default max order is 3. Here we use a default of 4, so must
    // call setMaxOrder to overwrite MacProj default.
    macproj.getLinOp().setMaxOrder(max_order);
    if ( max_fmg_iter > -1 )
      macproj.getMLMG().setMaxFmgIter(max_fmg_iter);

    //
    // Perform projection
    //
    macproj.project({mac_phi}, a_mac_tol, a_mac_abs_tol);

    if ( fluxes[0] )
      // fluxes = -B grad phi
      macproj.getFluxes({fluxes}, {mac_phi}, MLMG::Location::FaceCentroid);
}